

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_node_set * __thiscall
pugi::xpath_query::evaluate_node_set
          (xpath_node_set *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  xpath_ast_node *pxVar1;
  xpath_ast_node *this_00;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_node_set_raw local_20c8;
  xpath_context local_20a8;
  xpath_memory_block local_2088;
  xpath_memory_block local_1078;
  xpath_allocator local_68;
  xpath_allocator local_50;
  xpath_stack local_38;
  bool local_28 [8];
  
  if ((long *)this->_impl == (long *)0x0) {
    this_00 = (xpath_ast_node *)0x0;
  }
  else {
    pxVar1 = *this->_impl;
    this_00 = (xpath_ast_node *)0x0;
    if (pxVar1->_rettype == '\x01') {
      this_00 = pxVar1;
    }
  }
  if (this_00 == (xpath_ast_node *)0x0) {
    xpath_node_set::xpath_node_set(__return_storage_ptr__);
  }
  else {
    local_20a8.n._node._root = (n->_node)._root;
    local_20a8.n._attribute._attr = (n->_attribute)._attr;
    local_20a8.position = 1;
    local_20a8.size = 1;
    local_68._error = local_28;
    local_68._root = &local_2088;
    local_68._root_size = 0;
    local_50._root = &local_1078;
    local_50._root_size = 0;
    local_28[0] = false;
    local_1078.next = (xpath_memory_block *)0x0;
    local_2088.next = (xpath_memory_block *)0x0;
    local_1078.capacity = 0x1000;
    local_2088.capacity = 0x1000;
    local_50._error = local_68._error;
    local_38.result = &local_68;
    local_38.temp = &local_50;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (&local_20c8,this_00,&local_20a8,&local_38,nodeset_eval_all);
    if (local_28[0] == true) {
      xpath_node_set::xpath_node_set(__return_storage_ptr__);
    }
    else {
      xpath_node_set::xpath_node_set
                (__return_storage_ptr__,local_20c8._begin,local_20c8._end,local_20c8._type);
    }
    impl::anon_unknown_0::xpath_allocator::release(&local_68);
    impl::anon_unknown_0::xpath_allocator::release(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}